

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_unsigned_int>
* __thiscall
fmt::v7::make_args_checked<unsigned_int,unsigned_int,char[86],char>
          (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_unsigned_int>
           *__return_storage_ptr__,v7 *this,char (*format_str) [86],
          remove_reference_t<unsigned_int> *args,remove_reference_t<unsigned_int> *args_1)

{
  remove_reference_t<unsigned_int> *args_local_1;
  remove_reference_t<unsigned_int> *args_local;
  char (*format_str_local) [86];
  
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int,_unsigned_int>
  ::format_arg_store(__return_storage_ptr__,(uint *)format_str,args);
  return __return_storage_ptr__;
}

Assistant:

inline auto make_args_checked(const S& format_str,
                              const remove_reference_t<Args>&... args)
    -> format_arg_store<buffer_context<Char>, remove_reference_t<Args>...> {
  static_assert(
      detail::count<(
              std::is_base_of<detail::view, remove_reference_t<Args>>::value &&
              std::is_reference<Args>::value)...>() == 0,
      "passing views as lvalues is disallowed");
  detail::check_format_string<Args...>(format_str);
  return {args...};
}